

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprLHitGather(Fts3Expr *pExpr,MatchInfo *p)

{
  int local_1c;
  int rc;
  MatchInfo *p_local;
  Fts3Expr *pExpr_local;
  
  local_1c = 0;
  if ((pExpr->bEof == '\0') && (pExpr->iDocid == p->pCursor->iPrevId)) {
    if (pExpr->pLeft == (Fts3Expr *)0x0) {
      local_1c = fts3ExprLHits(pExpr,p);
    }
    else {
      local_1c = fts3ExprLHitGather(pExpr->pLeft,p);
      if (local_1c == 0) {
        local_1c = fts3ExprLHitGather(pExpr->pRight,p);
      }
    }
  }
  return local_1c;
}

Assistant:

static int fts3ExprLHitGather(
  Fts3Expr *pExpr,
  MatchInfo *p
){
  int rc = SQLITE_OK;
  assert( (pExpr->pLeft==0)==(pExpr->pRight==0) );
  if( pExpr->bEof==0 && pExpr->iDocid==p->pCursor->iPrevId ){
    if( pExpr->pLeft ){
      rc = fts3ExprLHitGather(pExpr->pLeft, p);
      if( rc==SQLITE_OK ) rc = fts3ExprLHitGather(pExpr->pRight, p);
    }else{
      rc = fts3ExprLHits(pExpr, p);
    }
  }
  return rc;
}